

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_MultiGFab.H
# Opt level: O2

void __thiscall amrex::EB2::GFab::define(GFab *this,Box *vbx)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int i;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  BaseFab<unsigned_int> *this_00;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Box bx;
  undefined8 local_48;
  
  uVar6 = *(undefined8 *)(vbx->smallend).vect;
  uVar2 = *(undefined8 *)((vbx->smallend).vect + 2);
  uVar3 = *(undefined8 *)((vbx->bigend).vect + 2);
  *(undefined8 *)(this->m_validbox).bigend.vect = *(undefined8 *)(vbx->bigend).vect;
  *(undefined8 *)((this->m_validbox).bigend.vect + 2) = uVar3;
  *(undefined8 *)(this->m_validbox).smallend.vect = uVar6;
  *(undefined8 *)((this->m_validbox).smallend.vect + 2) = uVar2;
  uVar9 = (vbx->btype).itype;
  iVar4 = (vbx->bigend).vect[1] + 2;
  iVar7 = (vbx->bigend).vect[2] + 2;
  iVar14 = (vbx->smallend).vect[0] + -2;
  iVar15 = (vbx->smallend).vect[1] + -2;
  iVar16 = (vbx->smallend).vect[2] + -2;
  iVar17 = (vbx->bigend).vect[0] + 2;
  bx.bigend.vect[0] = iVar17;
  bx.bigend.vect[1] = iVar4;
  bx.bigend.vect[2] = iVar7;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    if ((uVar9 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
      piVar1 = bx.bigend.vect + lVar5;
      *piVar1 = *piVar1 + 1;
    }
  }
  bx.btype.itype = 7;
  bx.smallend.vect[0] = iVar14;
  bx.smallend.vect[1] = iVar15;
  bx.smallend.vect[2] = iVar16;
  BaseFab<double>::resize(&this->m_levelset,&bx,1,(Arena *)0x0);
  iVar8 = (int)(uVar9 << 0x1e) >> 0x1f;
  iVar10 = (int)(uVar9 << 0x1d) >> 0x1f;
  iVar17 = iVar17 - (uVar9 & 1);
  this_00 = (this->m_edgetype)._M_elems;
  local_48 = 0x100000001;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    iVar13 = (int)lVar5;
    if (iVar13 == 1) {
      iVar11 = 0;
      uVar6 = 0x100000000;
      uVar9 = 2;
    }
    else if (iVar13 == 0) {
      uVar6 = 1;
      iVar11 = 0;
      uVar9 = 0;
    }
    else {
      uVar6 = 0;
      iVar11 = 1;
      uVar9 = 4;
    }
    bx.bigend.vect[0] = iVar17 + (uint)uVar6;
    bx.bigend.vect[1] = (int)((ulong)uVar6 >> 0x20) + iVar8 + iVar4;
    bx.bigend.vect[2] = iVar11 + iVar10 + iVar7;
    bx.btype.itype = uVar9 | (uint)uVar6;
    iVar11 = 1;
    bx.smallend.vect[0] = iVar14;
    bx.smallend.vect[1] = iVar15;
    bx.smallend.vect[2] = iVar16;
    BaseFab<unsigned_int>::resize(this_00 + -3,&bx,1,(Arena *)0x0);
    uVar9 = 2;
    uVar12 = 4;
    uVar6 = 0x100000000;
    if (iVar13 != 0) {
      if (iVar13 == 1) {
        uVar9 = 0;
        uVar6 = 1;
      }
      else {
        uVar12 = 0;
        iVar11 = 0;
        uVar6 = local_48;
      }
    }
    bx.bigend.vect[0] = iVar17 + (uint)uVar6;
    bx.bigend.vect[1] = (int)((ulong)uVar6 >> 0x20) + iVar8 + iVar4;
    bx.bigend.vect[2] = iVar11 + iVar10 + iVar7;
    bx.btype.itype = uVar9 | uVar12 | (uint)uVar6;
    bx.smallend.vect[0] = iVar14;
    bx.smallend.vect[1] = iVar15;
    bx.smallend.vect[2] = iVar16;
    BaseFab<unsigned_int>::resize(this_00,&bx,1,(Arena *)0x0);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void define(const Box& vbx) {
        m_validbox = vbx;
        const Box& bxg2 = amrex::grow(vbx,ng);
        m_levelset.resize(amrex::surroundingNodes(bxg2));
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            m_facetype[idim].resize(amrex::convert(bxg2,IntVect::TheDimensionVector(idim)));
#if (AMREX_SPACEDIM == 3)
            m_edgetype[idim].resize(amrex::convert(bxg2,IntVect::TheNodeVector()
                                                       -IntVect::TheDimensionVector(idim)));
#endif
        }
    }